

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  byte *pbVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int r_rel [4];
  
  pIVar3 = GImGui;
  IVar2 = this->Pos;
  auVar6._8_4_ = IVar2.x;
  auVar6._12_4_ = IVar2.y;
  auVar6._0_4_ = IVar2.x;
  auVar6._4_4_ = IVar2.y;
  lVar5 = 0;
  auVar6 = vsubps_avx((undefined1  [16])*r_abs,auVar6);
  uVar4 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  r_rel[0] = (int)auVar6._0_4_;
  r_rel[1] = (int)auVar6._4_4_;
  r_rel[2] = (int)auVar6._8_4_;
  r_rel[3] = (int)auVar6._12_4_;
  do {
    pbVar1 = (byte *)((long)r_rel + lVar5);
    lVar5 = lVar5 + 1;
    uVar4 = uVar4 >> 8 ^ GCrc32LookupTable[(uint)*pbVar1 ^ uVar4 & 0xff];
  } while (lVar5 != 0x10);
  uVar4 = ~uVar4;
  if (GImGui->ActiveId == uVar4) {
    GImGui->ActiveIdIsAlive = uVar4;
  }
  if (pIVar3->ActiveIdPreviousFrame == uVar4) {
    pIVar3->ActiveIdPreviousFrameIsAlive = true;
  }
  return uVar4;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}